

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::truncated_normal_dist<double>::cdf
          (truncated_normal_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double dVar1;
  
  param_type::mu(in_RDI);
  param_type::sigma(in_RDI);
  dVar1 = math::Phi((double)in_RDI);
  return (dVar1 - in_RDI->Phi_a) / (in_RDI->Phi_b - in_RDI->Phi_a);
}

Assistant:

cdf(result_type x) const {
      x -= P.mu();
      x /= P.sigma();
      return (math::Phi(x) - P.Phi_a) / (P.Phi_b - P.Phi_a);
    }